

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerNewScObjArray(Lowerer *this,Instr *newObjInstr)

{
  OpCode opcode;
  RegOpnd *baseOpnd;
  Instr *this_00;
  Func *pFVar1;
  ScriptContextInfo *pSVar2;
  code *pcVar3;
  LabelInstr *arrayInfo;
  bool bVar4;
  OpndKind OVar5;
  byte bVar6;
  ArgSlot AVar7;
  BailOutKind BVar8;
  uint length;
  uint uVar9;
  int iVar10;
  Instr *pIVar11;
  undefined4 *puVar12;
  JITTimeFunctionBody *pJVar13;
  JITTimeProfileInfo *pJVar14;
  LabelInstr *pLVar15;
  intptr_t iVar16;
  Lowerer *pLVar17;
  Opnd *pOVar18;
  Opnd *pOVar19;
  Opnd *src2Opnd;
  ProfiledInstr *instr;
  RegOpnd *pRVar20;
  StackSym *pSVar21;
  AddrOpnd *pAVar22;
  HelperCallOpnd *this_01;
  IndirOpnd *pIVar23;
  undefined4 extraout_var_00;
  BranchInstr *branchInstr;
  IntConstOpnd *src;
  intptr_t iVar24;
  ProfileId index;
  Lowerer *pLVar25;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_7a;
  Instr *local_78;
  Lowerer *local_70;
  LabelInstr *local_68;
  undefined8 local_60;
  intptr_t local_58;
  intptr_t local_50;
  LabelInstr *local_48;
  Func *local_40;
  Lowerer *local_38;
  Lowerer *this_02;
  undefined4 extraout_var;
  
  bVar4 = IR::Instr::HasEmptyArgOutChain(newObjInstr,(Instr **)0x0);
  if (bVar4) {
    IR::Instr::FreeSrc2(newObjInstr);
    pIVar11 = LowerNewScObjArrayNoArg(this,newObjInstr);
    return pIVar11;
  }
  local_40 = newObjInstr->m_func;
  pLVar25 = (Lowerer *)newObjInstr->m_src1;
  pLVar17 = pLVar25;
  OVar5 = IR::Opnd::GetKind((Opnd *)pLVar25);
  local_38 = this;
  if (OVar5 == OpndKindAddr) {
    pIVar11 = InsertLoweredRegionStartMarker(pLVar17,newObjInstr);
    instr = (ProfiledInstr *)newObjInstr;
  }
  else {
    if (((newObjInstr->field_0x38 & 0x10) == 0) ||
       (pLVar17 = (Lowerer *)newObjInstr, bVar4 = IR::Instr::OnlyHasLazyBailOut(newObjInstr), bVar4)
       ) {
      pIVar11 = LowerNewScObject(this,newObjInstr,true,true,false);
      return pIVar11;
    }
    pIVar11 = InsertLoweredRegionStartMarker(pLVar17,newObjInstr);
    BVar8 = IR::Instr::GetBailOutKind(newObjInstr);
    if ((BVar8 != BailOutOnNotNativeArray) &&
       (BVar8 = IR::Instr::GetBailOutKind(newObjInstr),
       BVar8 != (LazyBailOut|BailOutOnNotNativeArray))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1462,
                         "(newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray))"
                         ,
                         "newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)"
                        );
      if (!bVar4) goto LAB_005a4b88;
      *puVar12 = 0;
    }
    pFVar1 = local_40;
    local_78 = pIVar11;
    pLVar15 = IR::LabelInstr::New(Label,local_40,false);
    iVar10 = (*newObjInstr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x10])();
    pLVar17 = (Lowerer *)CONCAT44(extraout_var,iVar10);
    pAVar22 = IR::AddrOpnd::New((intptr_t)pLVar17,AddrOpndKindDynamicVar,newObjInstr->m_func,false,
                                (Var)0x0);
    local_70 = pLVar25;
    local_60 = pLVar15;
    InsertCompareBranch(pLVar17,(Opnd *)pLVar25,&pAVar22->super_Opnd,BrEq_A,true,pLVar15,newObjInstr
                        ,false);
    opcode = newObjInstr->m_opcode;
    pOVar18 = IR::Instr::UnlinkDst(newObjInstr);
    pOVar19 = IR::Instr::UnlinkSrc1(newObjInstr);
    src2Opnd = IR::Instr::UnlinkSrc2(newObjInstr);
    instr = IR::ProfiledInstr::New(opcode,pOVar18,pOVar19,src2Opnd,pFVar1);
    pLVar25 = local_38;
    if (newObjInstr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar4) goto LAB_005a4b88;
      *puVar12 = 0;
    }
    (instr->u).profileId = *(uint *)&newObjInstr[1]._vptr_Instr;
    IR::Instr::InsertAfter(newObjInstr,&instr->super_Instr);
    newObjInstr->m_opcode = BailOut;
    GenerateBailOut(pLVar25,newObjInstr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    IR::Instr::InsertBefore(&instr->super_Instr,&local_60->super_Instr);
    pIVar11 = local_78;
    pLVar25 = local_70;
  }
  if ((instr->super_Instr).m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1480,"(newObjInstr->IsProfiledInstr())","newObjInstr->IsProfiledInstr()");
    if (!bVar4) goto LAB_005a4b88;
    *puVar12 = 0;
  }
  baseOpnd = (RegOpnd *)(instr->super_Instr).m_dst;
  OVar5 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_005a4b88;
    *puVar12 = 0;
  }
  pLVar17 = (Lowerer *)(instr->super_Instr).m_next;
  if ((instr->super_Instr).m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
    if (!bVar4) goto LAB_005a4b88;
    *puVar12 = 0;
  }
  pFVar1 = local_40;
  local_60 = (LabelInstr *)(CONCAT44(local_60._4_4_,(instr->u).profileId) & 0xffffffff0000ffff);
  iVar16 = 0;
  local_48 = (LabelInstr *)0x0;
  iVar24 = 0;
  local_78 = pIVar11;
  local_70 = pLVar25;
  if ((~(instr->u).profileId & 0xffff) != 0) {
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(local_40->m_workItem);
    pJVar14 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar13);
    index = (ProfileId)local_60;
    pLVar15 = (LabelInstr *)JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar14,index);
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(pFVar1->m_workItem);
    pJVar14 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar13);
    iVar16 = JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar14,index);
    local_48 = pLVar15;
    if (pLVar15 == (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x148c,"(arrayInfo)","arrayInfo");
      if (!bVar4) goto LAB_005a4b88;
      *puVar12 = 0;
    }
    iVar24 = Func::GetWeakFuncRef(local_40);
    if (iVar24 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x148e,"(weakFuncRef)","weakFuncRef");
      if (!bVar4) goto LAB_005a4b88;
      *puVar12 = 0;
      iVar24 = 0;
    }
  }
  pFVar1 = local_40;
  local_58 = iVar16;
  local_50 = iVar24;
  local_68 = IR::LabelInstr::New(Label,local_40,true);
  pLVar15 = IR::LabelInstr::New(Label,pFVar1,false);
  pOVar18 = (instr->super_Instr).m_src2;
  OVar5 = IR::Opnd::GetKind(pOVar18);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1495,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
    if (!bVar4) goto LAB_005a4b88;
    *puVar12 = 0;
  }
  OVar5 = IR::Opnd::GetKind(pOVar18);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_005a4b88;
    *puVar12 = 0;
  }
  pSVar21 = (StackSym *)pOVar18[1]._vptr_Opnd;
  if ((pSVar21->super_Sym).m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar4) goto LAB_005a4b88;
    *puVar12 = 0;
  }
  if (((pSVar21->field_0x18 & 1) == 0) || ((pSVar21->field_5).m_instrDef == (Instr *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1497,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar4) goto LAB_005a4b88;
    *puVar12 = 0;
  }
  if ((pSVar21->field_0x18 & 1) == 0) {
    pIVar11 = (Instr *)0x0;
  }
  else {
    pIVar11 = (pSVar21->field_5).m_instrDef;
  }
  pOVar18 = pIVar11->m_src1;
  local_7a = (pOVar18->m_valueType).field_0;
  bVar4 = ValueType::IsLikelyInt((ValueType *)&local_7a.field_0);
  if ((bVar4) &&
     (((OVar5 = IR::Opnd::GetKind(pOVar18), OVar5 == OpndKindAddr ||
       (OVar5 = IR::Opnd::GetKind(pOVar18), OVar5 == OpndKindReg)) &&
      (AVar7 = StackSym::GetArgSlotNum(pSVar21), AVar7 == 2)))) {
    if (((pSVar21->field_0x1a & 0x10) != 0) && (*(short *)&(pSVar21->super_Sym).field_0x16 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
      if (!bVar4) goto LAB_005a4b88;
      *puVar12 = 0;
    }
    if ((pSVar21->field_0x1a & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x14a3,"(linkSym->IsArgSlotSym())","Not an argSlot symbol...");
      if (!bVar4) goto LAB_005a4b88;
      *puVar12 = 0;
    }
    pOVar19 = pIVar11->m_src2;
    OVar5 = IR::Opnd::GetKind(pOVar18);
    if (OVar5 == OpndKindReg) {
      OVar5 = IR::Opnd::GetKind(pOVar18);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005a4b88;
        *puVar12 = 0;
      }
      bVar4 = IR::Opnd::IsNotInt(pOVar18);
      arrayInfo = local_48;
      if (!bVar4) {
        if (local_48 == (LabelInstr *)0x0) {
LAB_005a4762:
          bVar4 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptArray>
                            (local_38,&instr->super_Instr,(ArrayCallSiteInfo *)arrayInfo,local_58,
                             local_50,local_68,pLVar15,pOVar18,0,0);
        }
        else if ((((ulong)(local_48->super_Instr)._vptr_Instr & 1) != 0) ||
                (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase), bVar4)) {
          if ((((ulong)(arrayInfo->super_Instr)._vptr_Instr & 2) != 0) ||
             (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase), bVar4))
          goto LAB_005a4762;
          bVar4 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeFloatArray>
                            (local_38,&instr->super_Instr,(ArrayCallSiteInfo *)arrayInfo,local_58,
                             local_50,local_68,pLVar15,pOVar18,0x1a,0x38);
        }
        else {
          bVar4 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeIntArray>
                            (local_38,&instr->super_Instr,(ArrayCallSiteInfo *)arrayInfo,local_58,
                             local_50,local_68,pLVar15,pOVar18,0x1a,0x38);
        }
LAB_005a47bd:
        if (bVar4 != false) {
          pRVar20 = IR::Opnd::AsRegOpnd(pOVar19);
          pSVar21 = Sym::AsStackSym(&pRVar20->m_sym->super_Sym);
          bVar4 = StackSym::IsArgSlotSym(pSVar21);
          if ((bVar4) || ((pSVar21->field_0x18 & 1) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar12 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x14cc,"(!linkSym->IsArgSlotSym() && linkSym->m_isSingleDef)",
                               "Arg tree not single def...");
            if (!bVar4) goto LAB_005a4b88;
            *puVar12 = 0;
          }
          this_00 = (pSVar21->field_5).m_instrDef;
          uVar9 = IR::Instr::GetArgOutCount(this_00,false);
          if (uVar9 != 2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar12 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x14cf,"(startCallInstr->GetArgOutCount(false) == 2)",
                               "Generating ArrayFastPath for more than 1 parameter not allowed.");
            if (!bVar4) goto LAB_005a4b88;
            *puVar12 = 0;
          }
          IR::Instr::Move(this_00,&instr->super_Instr);
          IR::Instr::Move(pIVar11,&instr->super_Instr);
        }
      }
    }
    else {
      length = StackSym::GetIntConstValue(pSVar21);
      if (length < 9) {
        bVar4 = GenerateProfiledNewScObjArrayFastPath
                          (local_38,&instr->super_Instr,(ArrayCallSiteInfo *)local_48,local_58,
                           local_50,length,pLVar15,false);
        goto LAB_005a47bd;
      }
    }
  }
  local_48 = pLVar15;
  IR::Instr::UnlinkSrc1(&instr->super_Instr);
  pFVar1 = local_40;
  pAVar22 = IR::AddrOpnd::New(local_58,AddrOpndKindDynamicArrayCallSiteInfo,local_40,false,(Var)0x0)
  ;
  LowererMD::LoadNewScObjFirstArg(&local_38->m_lowererMD,&instr->super_Instr,&pAVar22->super_Opnd,0)
  ;
  this_01 = IR::HelperCallOpnd::New(HelperScrArr_ProfiledNewInstance,pFVar1);
  if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_005a4b88;
    *puVar12 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_005a4b88:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar12 = 0;
  }
  bVar6 = (this_01->super_Opnd).field_0xb;
  if ((bVar6 & 2) != 0) {
    this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar1);
    bVar6 = (this_01->super_Opnd).field_0xb;
  }
  pLVar25 = local_38;
  (this_01->super_Opnd).field_0xb = bVar6 | 2;
  (instr->super_Instr).m_src1 = &this_01->super_Opnd;
  GenerateDirectCall(local_38,&instr->super_Instr,(Opnd *)local_70,1);
  pFVar1 = local_40;
  pIVar23 = IR::IndirOpnd::New(baseOpnd,0,TyUint64,local_40,false);
  pSVar2 = ((pLVar17->m_lowererMD).lowererMDArch.m_func)->m_scriptContextInfo;
  iVar10 = (*pSVar2->_vptr_ScriptContextInfo[0x21])(pSVar2,7);
  this_02 = (Lowerer *)CONCAT44(extraout_var_00,iVar10);
  pAVar22 = IR::AddrOpnd::New(this_02,AddrOpndKindDynamicVtable,pLVar25->m_func,false,(Var)0x0);
  pLVar15 = local_48;
  branchInstr = InsertCompareBranch(this_02,&pIVar23->super_Opnd,&pAVar22->super_Opnd,BrEq_A,true,
                                    local_48,(Instr *)pLVar17,false);
  LowererMD::InsertObjectPoison((Opnd *)baseOpnd,branchInstr,(Instr *)pLVar17,true);
  pIVar23 = IR::IndirOpnd::New(baseOpnd,0x1a,TyUint16,pFVar1,false);
  src = IR::Opnd::CreateProfileIdOpnd((ProfileId)local_60,pFVar1);
  InsertMove(&pIVar23->super_Opnd,&src->super_Opnd,(Instr *)pLVar17,true);
  pIVar23 = IR::IndirOpnd::New(baseOpnd,0x38,TyInt64,pFVar1,false);
  pAVar22 = IR::AddrOpnd::New(local_50,AddrOpndKindDynamicFunctionBodyWeakRef,pFVar1,false,(Var)0x0)
  ;
  InsertMove(&pIVar23->super_Opnd,&pAVar22->super_Opnd,(Instr *)pLVar17,true);
  IR::Instr::InsertBefore((Instr *)pLVar17,&pLVar15->super_Instr);
  pIVar11 = RemoveLoweredRegionStartMarker(pLVar17,local_78);
  return pIVar11;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScObjArray(IR::Instr *newObjInstr)
{
    if (newObjInstr->HasEmptyArgOutChain())
    {
        newObjInstr->FreeSrc2();
        return LowerNewScObjArrayNoArg(newObjInstr);
    }

    IR::Instr* startMarkerInstr = nullptr;

    IR::Opnd *targetOpnd = newObjInstr->GetSrc1();
    Func *func = newObjInstr->m_func;

    if (!targetOpnd->IsAddrOpnd())
    {
        if (!newObjInstr->HasBailOutInfo() || newObjInstr->OnlyHasLazyBailOut())
        {
            return this->LowerNewScObject(newObjInstr, true, true);
        }

        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);

        // For whatever reason, we couldn't do a fixed function check on the call target.
        // Generate a runtime check on the target.
        Assert(
            newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray ||
            newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)
        );
        IR::LabelInstr *labelSkipBailOut = IR::LabelInstr::New(Js::OpCode::Label, func);
        InsertCompareBranch(
            targetOpnd,
            LoadLibraryValueOpnd(newObjInstr, LibraryValue::ValueArrayConstructor),
            Js::OpCode::BrEq_A,
            true,
            labelSkipBailOut,
            newObjInstr);

        IR::ProfiledInstr *instrNew = IR::ProfiledInstr::New(newObjInstr->m_opcode, newObjInstr->UnlinkDst(), newObjInstr->UnlinkSrc1(), newObjInstr->UnlinkSrc2(), func);
        instrNew->u.profileId = newObjInstr->AsProfiledInstr()->u.profileId;
        newObjInstr->InsertAfter(instrNew);
        newObjInstr->m_opcode = Js::OpCode::BailOut;
        GenerateBailOut(newObjInstr);

        instrNew->InsertBefore(labelSkipBailOut);
        newObjInstr = instrNew;
    }
    else
    {
        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);
    }

    intptr_t weakFuncRef = 0;
    Js::ArrayCallSiteInfo *arrayInfo = nullptr;
    intptr_t arrayInfoAddr = 0;
    Assert(newObjInstr->IsProfiledInstr());

    IR::RegOpnd *resultObjOpnd = newObjInstr->GetDst()->AsRegOpnd();
    IR::Instr * insertInstr = newObjInstr->m_next;

    Js::ProfileId profileId = static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId);

    // We may not have profileId if we converted a NewScObject to NewScObjArray
    if (profileId != Js::Constants::NoProfileId)
    {
        arrayInfo = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
        arrayInfoAddr = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);
        Assert(arrayInfo);
        weakFuncRef = func->GetWeakFuncRef();
        Assert(weakFuncRef);
    }

    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func);
    IR::Opnd *linkOpnd = newObjInstr->GetSrc2();

    Assert(linkOpnd->IsSymOpnd());
    StackSym *linkSym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();
    Assert(linkSym->IsSingleDef());
    IR::Instr* argInstr = linkSym->GetInstrDef();
    IR::Opnd *opndOfArrayCtor = argInstr->GetSrc1();
    const uint16 upperBoundValue = 8;
    // Generate fast path only if it meets all the conditions:
    // 1. It is the only parameter and it is a likely int
    // 2a. If 1st parameter is a variable, emit fast path with checks
    // 2b. If 1st parameter is a constant, it is in range 0 and upperBoundValue (inclusive)
    if (opndOfArrayCtor->GetValueType().IsLikelyInt() && (opndOfArrayCtor->IsAddrOpnd() || opndOfArrayCtor->IsRegOpnd())) // #1
    {
        if ((linkSym->GetArgSlotNum() == 2)) // 1. It is the only parameter
        {
            AssertMsg(linkSym->IsArgSlotSym(), "Not an argSlot symbol...");
            linkOpnd = argInstr->GetSrc2();

            bool emittedFastPath = false;
            // 2a. If 1st parameter is a variable, emit fast path with checks
            if (opndOfArrayCtor->IsRegOpnd())
            {
                if (!opndOfArrayCtor->AsRegOpnd()->IsNotInt())
                {
                    // 3. GenerateFastPath
                    if (arrayInfo && arrayInfo->IsNativeIntArray())
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeIntArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor,
                                                                Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex(),
                                                                Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef());
                    }
                    else if (arrayInfo && arrayInfo->IsNativeFloatArray())
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeFloatArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor,
                                                                  Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex(),
                                                                  Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef());
                    }
                    else
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor, 0, 0);
                    }
                }
            }
            // 2b. If 1st parameter is a constant, it is in range 0 and upperBoundValue (inclusive)
            else
            {
                int32 length = linkSym->GetIntConstValue();
                if (length >= 0 && length <= upperBoundValue)
                {
                    emittedFastPath = GenerateProfiledNewScObjArrayFastPath(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, (uint32)length, labelDone, false);
                }
            }
            // Since we emitted fast path above, move the startCall/argOut instruction right before helper
            if (emittedFastPath)
            {
                linkSym = linkOpnd->AsRegOpnd()->m_sym->AsStackSym();
                AssertMsg(!linkSym->IsArgSlotSym() && linkSym->m_isSingleDef, "Arg tree not single def...");

                IR::Instr* startCallInstr = linkSym->m_instrDef;
                AssertMsg(startCallInstr->GetArgOutCount(false) == 2, "Generating ArrayFastPath for more than 1 parameter not allowed.");

                // Since we emitted fast path above, move the startCall/argOut instruction right before helper
                startCallInstr->Move(newObjInstr);
                argInstr->Move(newObjInstr);
            }
        }
    }
    newObjInstr->UnlinkSrc1();

    IR::Opnd *profileOpnd = IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, func);
    this->m_lowererMD.LoadNewScObjFirstArg(newObjInstr, profileOpnd);

    IR::JnHelperMethod helperMethod = IR::HelperScrArr_ProfiledNewInstance;

    newObjInstr->SetSrc1(IR::HelperCallOpnd::New(helperMethod, func));
    newObjInstr = GenerateDirectCall(newObjInstr, targetOpnd, Js::CallFlags_New);

    IR::BranchInstr* branchInstr = InsertCompareBranch(
        IR::IndirOpnd::New(resultObjOpnd, 0, TyMachPtr, func),
        LoadVTableValueOpnd(insertInstr, VTableValue::VtableJavascriptArray),
        Js::OpCode::BrEq_A,
        true,
        labelDone,
        insertInstr);

    InsertObjectPoison(resultObjOpnd, branchInstr, insertInstr, true);
    // We know we have a native array, so store the weak ref and call site index.
    InsertMove(
        IR::IndirOpnd::New(resultObjOpnd, Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex(), TyUint16, func),
        IR::Opnd::CreateProfileIdOpnd(profileId, func),
        insertInstr);
    InsertMove(
        IR::IndirOpnd::New(resultObjOpnd, Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef(), TyMachReg, func),
        IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, func),
        insertInstr);
    insertInstr->InsertBefore(labelDone);

    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}